

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_utils.cpp
# Opt level: O0

GgxFilterUnifLocs tg::getFilterCubamap_ggx_unifLocs(u32 prog)

{
  GgxFilterUnifLocs GVar1;
  GLint GVar2;
  GLint GVar3;
  GLint GVar4;
  bool bVar5;
  u32 prog_local;
  GgxFilterUnifLocs locs;
  
  GVar2 = (*glad_debug_glGetUniformLocation)(prog,"u_cubemap");
  GVar3 = (*glad_debug_glGetUniformLocation)(prog,"u_numSamples");
  GVar4 = (*glad_debug_glGetUniformLocation)(prog,"u_rough2");
  bVar5 = false;
  if ((GVar2 != -1) && (bVar5 = false, GVar3 != -1)) {
    bVar5 = GVar4 != -1;
  }
  if (!bVar5) {
    __assert_fail("locs.cubemap != -1 && locs.numSamples != -1 && locs.roughness2 != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/tg/texture_utils.cpp"
                  ,0x144,"GgxFilterUnifLocs tg::getFilterCubamap_ggx_unifLocs(u32)");
  }
  GVar1.numSamples = GVar3;
  GVar1.cubemap = GVar2;
  GVar1.roughness2 = GVar4;
  return GVar1;
}

Assistant:

GgxFilterUnifLocs getFilterCubamap_ggx_unifLocs(u32 prog)
{
    GgxFilterUnifLocs locs;
    locs.cubemap = glGetUniformLocation(prog, "u_cubemap");
    locs.numSamples = glGetUniformLocation(prog, "u_numSamples");
    locs.roughness2 = glGetUniformLocation(prog, "u_rough2");
    assert(locs.cubemap != -1 && locs.numSamples != -1 && locs.roughness2 != -1);
    return locs;
}